

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Gia_ManIteratePaths(Gia_Man_t *p,int DelayC,int nPathMin,int nPathMax,int nPathLimit,
                       int fIgnoreBoxDelays,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *vPath;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int nBoxes;
  Vec_Int_t **local_38;
  
  vPath = Vec_IntAlloc(100);
  if (p->vLevels != (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevels == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                  ,0x4b1,"int Gia_ManIteratePaths(Gia_Man_t *, int, int, int, int, int, int)");
  }
  iVar7 = p->nObjs;
  pVVar3 = Vec_IntAlloc(iVar7);
  pVVar3->nSize = iVar7;
  if (pVVar3->pArray != (int *)0x0) {
    memset(pVVar3->pArray,0,(long)iVar7 << 2);
  }
  local_38 = &p->vLevels;
  p->vLevels = pVVar3;
  Gia_ManCleanMark01(p);
  Gia_ManCleanPhase(p);
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCi(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar4->field_0x7 = pGVar4->field_0x7 | 0x80;
  }
  if (fVerbose != 0) {
    printf("Running path detection: BoxDelay = %d, PathMin = %d, PathMax = %d, PathLimit = %d.\n",
           (ulong)(uint)DelayC,(ulong)(uint)nPathMin,(ulong)(uint)nPathMax,(ulong)(uint)nPathLimit);
  }
  if (nPathLimit < 1) {
    nPathLimit = 0;
  }
  uVar6 = 0;
  for (uVar5 = 0; nPathLimit != uVar5; uVar5 = uVar5 + 1) {
    iVar7 = DelayC;
    uVar1 = Gia_ManFindAnnotatedDelay(p,DelayC,&nBoxes,fIgnoreBoxDelays);
    uVar2 = Gia_ManFindPath(p,iVar7,nPathMin,nPathMax,vPath);
    if (uVar2 == 0xffffffff) break;
    uVar6 = uVar6 + (0 < (int)uVar2);
    if (fVerbose != 0) {
      printf("Iter %5d : Paths = %2d. Boxes = %2d. Total boxes = %6d.  Max delay = %5d.\n",
             (ulong)uVar5,(ulong)uVar6,(ulong)uVar2,(ulong)(uint)nBoxes,(ulong)uVar1);
    }
  }
  Vec_IntFree(vPath);
  Vec_IntFreeP(local_38);
  Gia_ManCleanPhase(p);
  return 1;
}

Assistant:

int Gia_ManIteratePaths( Gia_Man_t * p, int DelayC, int nPathMin, int nPathMax, int nPathLimit, int fIgnoreBoxDelays, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vPath = Vec_IntAlloc( 100 );
    int i, RetValue, nBoxes, MaxDelay, nPaths = 0;
    assert( p->vLevels == NULL );
    p->vLevels = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManCleanMark01( p );
    Gia_ManCleanPhase( p );
    Gia_ManForEachCi( p, pObj, i )
        pObj->fPhase = 1;
    if ( fVerbose )
        printf( "Running path detection: BoxDelay = %d, PathMin = %d, PathMax = %d, PathLimit = %d.\n", DelayC, nPathMin, nPathMax, nPathLimit );
    for ( i = 0; i < nPathLimit; i++ )
    {
        MaxDelay = Gia_ManFindAnnotatedDelay( p, DelayC, &nBoxes, fIgnoreBoxDelays );
        RetValue = Gia_ManFindPath( p, DelayC, nPathMin, nPathMax, vPath );
        if ( RetValue == -1 )
            break;
        nPaths += (RetValue > 0);
        if ( fVerbose )
            printf( "Iter %5d : Paths = %2d. Boxes = %2d. Total boxes = %6d.  Max delay = %5d.\n", i, nPaths, RetValue, nBoxes, MaxDelay );
    }
    Vec_IntFree( vPath );
    Vec_IntFreeP( &p->vLevels );
    Gia_ManCleanPhase( p );
    return 1;
}